

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<float,_10>::Expand(TPZManVector<float,_10> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ulong in_RSI;
  long in_RDI;
  int64_t i;
  float *newstore;
  long local_20;
  
  if ((*(long *)(in_RDI + 0x18) < (long)in_RSI) && (10 < (long)in_RSI)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x10); local_20 = local_20 + 1) {
      *(undefined4 *)((long)pvVar3 + local_20 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 8) + local_20 * 4);
    }
    if ((*(long *)(in_RDI + 8) != in_RDI + 0x20) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(void **)(in_RDI + 8) = pvVar3;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}